

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O1

void model_rd_for_sb_y(AV1_COMP *cpi,BLOCK_SIZE bsize,MACROBLOCK *x,MACROBLOCKD *xd,
                      RD_STATS *rd_stats,uint *var_out,int calculate_rd,int *early_term)

{
  RD_STATS *pRVar1;
  ulong uVar2;
  ulong uVar3;
  TX_SIZE TVar4;
  uint var;
  int iVar5;
  byte bVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  char cVar10;
  double dVar11;
  int force_skip;
  uint sse;
  double rate_f;
  int local_7c;
  uint *local_78;
  uint local_6c;
  long local_68;
  RD_STATS *local_60;
  double local_58;
  ulong local_50;
  ulong local_48;
  double local_40;
  double local_38;
  
  if ((early_term != (int *)0x0) && (x->force_zeromv_skip_for_blk != 0)) {
    *early_term = 1;
    rd_stats->rate = 0;
    rd_stats->dist = 0;
    rd_stats->sse = 0;
  }
  local_68 = (long)(*xd->mi)->ref_frame[0];
  local_78 = var_out;
  local_60 = rd_stats;
  var = (*cpi->ppi->fn_ptr[bsize].vf)
                  (x->plane[0].src.buf,x->plane[0].src.stride,xd->plane[0].dst.buf,
                   xd->plane[0].dst.stride,&local_6c);
  local_7c = 0;
  local_48 = (ulong)local_6c;
  local_50 = (ulong)bsize;
  TVar4 = calculate_tx_size(cpi,bsize,x,var,local_6c,&local_7c);
  uVar3 = local_48;
  uVar2 = local_50;
  pRVar1 = local_60;
  lVar8 = local_68;
  (*xd->mi)->tx_size = TVar4;
  if (local_78 != (uint *)0x0) {
    *local_78 = var;
  }
  cVar10 = (char)local_68;
  lVar7 = 0x7fffffff;
  iVar5 = 0x7fffffff;
  if ((calculate_rd != 0) && ((local_7c == 0 || (cVar10 == '\0')))) {
    bVar6 = 3;
    if ((((x->e_mbd).cur_buf)->flags & 8) != 0) {
      bVar6 = (char)(x->e_mbd).bd - 5;
    }
    if (local_48 == 0) {
      lVar7 = 0;
      iVar5 = 0;
    }
    else {
      iVar9 = (int)x->plane[0].dequant_QTX[1] >> (bVar6 & 0x1f);
      iVar5 = 1;
      if (1 < iVar9) {
        iVar5 = iVar9;
      }
      local_58 = (double)((uint)block_size_high[local_50] * (uint)block_size_wide[local_50]);
      local_78 = (uint *)((double)(long)local_48 / local_58);
      dVar11 = log2((double)local_78 / ((double)iVar5 * (double)iVar5));
      av1_model_rd_curvfit((BLOCK_SIZE)uVar2,(double)local_78,dVar11,&local_38,&local_40);
      dVar11 = 0.0;
      if (0.0 <= local_38 * local_58) {
        dVar11 = local_38 * local_58;
      }
      iVar9 = (int)(dVar11 + 0.5);
      if (iVar9 == 0) {
        lVar7 = uVar3 << 4;
        iVar5 = 0;
      }
      else {
        local_58 = (double)local_78 * local_40 * local_58;
        dVar11 = 0.0;
        if (0.0 <= local_58) {
          dVar11 = local_58;
        }
        lVar7 = uVar3 << 4;
        iVar5 = 0;
        if ((long)(dVar11 + 0.5) * 0x80 + ((long)x->rdmult * (long)iVar9 + 0x100 >> 9) <
            (long)(uVar3 * 0x800)) {
          lVar7 = (long)(dVar11 + 0.5);
          iVar5 = iVar9;
        }
      }
    }
  }
  pRVar1->sse = (ulong)local_6c;
  x->pred_sse[lVar8] = local_6c;
  lVar8 = (ulong)local_6c << 4;
  iVar9 = 0;
  if (local_7c == 0 || cVar10 < '\x01') {
    lVar8 = lVar7;
    iVar9 = iVar5;
  }
  pRVar1->skip_txfm = iVar9 == 0;
  pRVar1->rate = iVar9;
  pRVar1->dist = lVar8;
  return;
}

Assistant:

static void model_rd_for_sb_y(const AV1_COMP *const cpi, BLOCK_SIZE bsize,
                              MACROBLOCK *x, MACROBLOCKD *xd,
                              RD_STATS *rd_stats, unsigned int *var_out,
                              int calculate_rd, int *early_term) {
  if (x->force_zeromv_skip_for_blk && early_term != NULL) {
    *early_term = 1;
    rd_stats->rate = 0;
    rd_stats->dist = 0;
    rd_stats->sse = 0;
  }

  // Note our transform coeffs are 8 times an orthogonal transform.
  // Hence quantizer step is also 8 times. To get effective quantizer
  // we need to divide by 8 before sending to modeling function.
  const int ref = xd->mi[0]->ref_frame[0];

  assert(bsize < BLOCK_SIZES_ALL);

  struct macroblock_plane *const p = &x->plane[AOM_PLANE_Y];
  struct macroblockd_plane *const pd = &xd->plane[AOM_PLANE_Y];
  unsigned int sse;
  int rate;
  int64_t dist;

  unsigned int var = cpi->ppi->fn_ptr[bsize].vf(
      p->src.buf, p->src.stride, pd->dst.buf, pd->dst.stride, &sse);
  int force_skip = 0;
  xd->mi[0]->tx_size = calculate_tx_size(cpi, bsize, x, var, sse, &force_skip);
  if (var_out) {
    *var_out = var;
  }

  if (calculate_rd && (!force_skip || ref == INTRA_FRAME)) {
    const int bwide = block_size_wide[bsize];
    const int bhigh = block_size_high[bsize];
    model_rd_with_curvfit(cpi, x, bsize, AOM_PLANE_Y, sse, bwide * bhigh, &rate,
                          &dist);
  } else {
    rate = INT_MAX;  // this will be overwritten later with av1_block_yrd
    dist = INT_MAX;
  }
  rd_stats->sse = sse;
  x->pred_sse[ref] = (unsigned int)AOMMIN(sse, UINT_MAX);

  if (force_skip && ref > INTRA_FRAME) {
    rate = 0;
    dist = (int64_t)sse << 4;
  }

  assert(rate >= 0);

  rd_stats->skip_txfm = (rate == 0);
  rate = AOMMIN(rate, INT_MAX);
  rd_stats->rate = rate;
  rd_stats->dist = dist;
}